

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSmallDeterminant.cpp
# Opt level: O3

HaF64 Determinant4x4(HaF64 (*matrix) [4],HaF64 *error)

{
  HaF64 HVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined8 uVar4;
  bool bVar5;
  HaF64 (*paHVar6) [4];
  HaI32 j;
  long lVar7;
  HaI32 k;
  long lVar8;
  int iVar9;
  HaI32 i;
  long lVar10;
  undefined1 auVar11 [16];
  HaF64 HVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  HaF64 parcialError;
  HaF64 cofactor [3] [3];
  HaF64 local_a0;
  ulong local_98;
  ulong uStack_90;
  double local_88;
  ulong uStack_80;
  HaF64 local_78 [10];
  
  local_88 = 1.0;
  uStack_80 = 0;
  auVar15 = ZEXT816(0) << 0x40;
  auVar13 = ZEXT816(0) << 0x40;
  lVar10 = 0;
  local_98 = 0x8000000000000000;
  uStack_90 = 0x8000000000000000;
  do {
    lVar7 = 0;
    paHVar6 = matrix;
    do {
      lVar8 = 0;
      iVar9 = 0;
      do {
        if (lVar10 != lVar8) {
          local_78[lVar7 * 3 + (long)iVar9] = (*paHVar6)[lVar8];
          iVar9 = iVar9 + 1;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar7 = lVar7 + 1;
      paHVar6 = paHVar6 + 1;
    } while (lVar7 != 3);
    HVar12 = Determinant3x3((HaF64 (*) [3])local_78,&local_a0);
    HVar1 = matrix[3][lVar10];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = HVar1;
    lVar10 = lVar10 + 1;
    dVar3 = local_88 * (double)HVar12;
    auVar13._8_8_ = 0;
    auVar16._0_8_ = (ulong)HVar1 ^ local_98;
    auVar16._8_8_ = uStack_90;
    local_88 = (double)((ulong)local_88 ^ local_98);
    uStack_80 = uStack_80 ^ uStack_90;
    uVar4 = vcmpsd_avx512f(auVar16,auVar14,6);
    bVar5 = (bool)((byte)uVar4 & 1);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar3;
    auVar13 = vfmadd231sd_fma(auVar13,auVar14,auVar17);
    auVar11._0_8_ = bVar5 * auVar16._0_8_ + (ulong)!bVar5 * (long)HVar1;
    auVar11._8_8_ = 0;
    auVar15._8_8_ = 0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_a0;
    auVar15 = vfmadd231sd_fma(auVar15,auVar11,auVar2);
  } while (lVar10 != 4);
  *error = auVar15._0_8_;
  return auVar13._0_8_;
}

Assistant:

hacd::HaF64 Determinant4x4 (const hacd::HaF64 matrix[4][4], hacd::HaF64* const error)
{
	hacd::HaF64 sign = hacd::HaF64 (1.0f);
	hacd::HaF64 det = hacd::HaF64 (0.0f);
	hacd::HaF64 accError = hacd::HaF64 (0.0f); 
	for (hacd::HaI32 i = 0; i < 4; i ++)  {
		hacd::HaF64 cofactor[3][3];
		for (hacd::HaI32 j = 0; j < 3; j ++) {
			hacd::HaI32 k0 = 0;
			for (hacd::HaI32 k = 0; k < 4; k ++) {
				if (k != i) {
					cofactor[j][k0] = matrix[j][k];
					k0 ++;
				}
			}
		}

		hacd::HaF64 parcialError;
		hacd::HaF64 minorDet = Determinant3x3 (cofactor, &parcialError);
		accError +=  parcialError * Absolute (matrix[3][i]);
		det += sign * minorDet * matrix[3][i];
		sign *= hacd::HaF64 (-1.0f);
	}

	*error = accError;
	return det;
}